

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

SubprocessResult *
phosg::run_process(SubprocessResult *__return_storage_ptr__,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *cmd,string *stdin_data,bool check,string *cwd,
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *env,size_t timeout_usecs)

{
  pointer *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  uint uVar5;
  mapped_type *ppbVar6;
  char *pcVar7;
  size_type sVar8;
  size_type sVar9;
  int *piVar10;
  runtime_error *prVar11;
  uint *puVar12;
  uint64_t uVar13;
  char *pcVar14;
  int error;
  int error_00;
  int __sig;
  int error_01;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_Buffer>,_false,_false>,_bool> pVar15;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_false,_false>,_bool>
  pVar16;
  string local_300;
  undefined1 local_2d9;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  long local_298;
  ssize_t bytes_read_1;
  size_t read_offset_1;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *it;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  *__range1;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ssize_t local_220;
  ssize_t bytes_written;
  size_t bytes_to_write;
  mapped_type *buf_1;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  ssize_t local_1c0;
  ssize_t bytes_read;
  size_t read_offset;
  string *buf;
  pair<const_int,_short> *pfd;
  iterator __end2;
  iterator __begin2;
  unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  int local_134;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_false>
  local_130;
  undefined1 local_128;
  SubprocessResult *local_120;
  int local_114;
  _Node_iterator_base<std::pair<const_int,_Buffer>,_false> local_110;
  undefined1 local_108;
  int local_fc;
  undefined1 local_f8 [8];
  Poll p;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  read_fd_to_buffer;
  unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
  write_fd_to_buffer;
  Subprocess sp;
  ulong local_48;
  uint64_t start_time;
  bool terminated;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *env_local;
  string *cwd_local;
  string *psStack_20;
  bool check_local;
  string *stdin_data_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd_local;
  SubprocessResult *ret;
  
  psStack_20 = stdin_data;
  stdin_data_local = (string *)cmd;
  cmd_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)__return_storage_ptr__;
  SubprocessResult::SubprocessResult(__return_storage_ptr__);
  bVar2 = false;
  local_48 = now();
  Subprocess::Subprocess
            ((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)stdin_data_local,-1,-1,-1,cwd,env);
  iVar3 = Subprocess::stdin_fd((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4));
  make_fd_nonblocking(iVar3);
  iVar3 = Subprocess::stdout_fd((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4))
  ;
  make_fd_nonblocking(iVar3);
  iVar3 = Subprocess::stderr_fd((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4))
  ;
  make_fd_nonblocking(iVar3);
  ::std::
  unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
  ::unordered_map((unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
                   *)&read_fd_to_buffer._M_h._M_single_bucket);
  ::std::
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  ::unordered_map((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                   *)&p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  Poll::Poll((Poll *)local_f8);
  if (psStack_20 == (string *)0x0) {
    iVar3 = Subprocess::stdin_fd
                      ((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4));
    close(iVar3);
  }
  else {
    local_fc = Subprocess::stdin_fd
                         ((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4));
    pVar15 = ::std::
             unordered_map<int,phosg::run_process(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const*,bool,std::__cxx11::string_const*,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const*,unsigned_long)::Buffer,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,phosg::run_process(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const*,bool,std::__cxx11::string_const*,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const*,unsigned_long)::Buffer>>>
             ::emplace<int,std::__cxx11::string_const*&>
                       ((unordered_map<int,phosg::run_process(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const*,bool,std::__cxx11::string_const*,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const*,unsigned_long)::Buffer,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,phosg::run_process(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const*,bool,std::__cxx11::string_const*,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const*,unsigned_long)::Buffer>>>
                         *)&read_fd_to_buffer._M_h._M_single_bucket,&local_fc,
                        &stack0xffffffffffffffe0);
    local_110._M_cur =
         (__node_type *)
         pVar15.first.super__Node_iterator_base<std::pair<const_int,_Buffer>,_false>._M_cur;
    local_108 = pVar15.second;
    iVar3 = Subprocess::stdin_fd
                      ((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4));
    Poll::add((Poll *)local_f8,iVar3,4);
  }
  local_114 = Subprocess::stdout_fd
                        ((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4));
  local_120 = __return_storage_ptr__;
  pVar16 = ::std::
           unordered_map<int,std::__cxx11::string*,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string*>>>
           ::emplace<int,std::__cxx11::string*>
                     ((unordered_map<int,std::__cxx11::string*,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string*>>>
                       *)&p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,&local_114,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      &local_120);
  local_130._M_cur =
       (__node_type *)
       pVar16.first.
       super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_false>
       ._M_cur;
  local_128 = pVar16.second;
  iVar3 = Subprocess::stdout_fd((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4))
  ;
  Poll::add((Poll *)local_f8,iVar3,1);
  local_134 = Subprocess::stderr_fd
                        ((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4));
  local_140 = &__return_storage_ptr__->stderr_contents;
  ::std::
  unordered_map<int,std::__cxx11::string*,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string*>>>
  ::emplace<int,std::__cxx11::string*>
            ((unordered_map<int,std::__cxx11::string*,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string*>>>
              *)&p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,&local_134,&local_140);
  iVar3 = Subprocess::stderr_fd((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4))
  ;
  Poll::add((Poll *)local_f8,iVar3,1);
  do {
    _Var4 = Subprocess::wait((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4),
                             (void *)0x1);
    __return_storage_ptr__->exit_status = _Var4;
    if (_Var4 != -1) {
      uVar13 = now();
      __return_storage_ptr__->elapsed_time = uVar13 - __return_storage_ptr__->elapsed_time;
      this = &p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      __end1 = ::std::
               unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
               ::begin((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                        *)this);
      it = (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            *)::std::
              unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
              ::end((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                     *)this);
      do {
        bVar2 = ::std::__detail::operator==
                          (&__end1.
                            super__Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_false>
                           ,(_Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_false>
                             *)&it);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          if ((check) &&
             (_Var4 = Subprocess::wait((Subprocess *)
                                       ((long)&write_fd_to_buffer._M_h._M_single_bucket + 4),
                                       (void *)0x0), _Var4 != 0)) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            uVar5 = Subprocess::wait((Subprocess *)
                                     ((long)&write_fd_to_buffer._M_h._M_single_bucket + 4),
                                     (void *)0x0);
            pcVar7 = ::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                               (&__return_storage_ptr__->stdout_contents);
            pcVar14 = ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                (&__return_storage_ptr__->stderr_contents);
            string_printf_abi_cxx11_
                      (&local_300,"command returned code %d\nstdout:\n%s\nstderr:\n%s",(ulong)uVar5,
                       pcVar7,pcVar14);
            ::std::runtime_error::runtime_error(prVar11,(string *)&local_300);
            __cxa_throw(prVar11,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          Poll::~Poll((Poll *)local_f8);
          ::std::
          unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          ::~unordered_map((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                            *)&p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          ::std::
          unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
          ::~unordered_map((unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
                            *)&read_fd_to_buffer._M_h._M_single_bucket);
          Subprocess::~Subprocess
                    ((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4));
          return __return_storage_ptr__;
        }
        read_offset_1 =
             (size_t)::std::__detail::
                     _Node_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_false,_false>
                     ::operator*(&__end1);
        while( true ) {
          bytes_read_1 = ::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                   (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      **)(read_offset_1 + 8));
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (read_offset_1 + 8),bytes_read_1 + 0x20000);
          iVar3 = *(int *)read_offset_1;
          pcVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::data(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           (read_offset_1 + 8));
          local_298 = ::read(iVar3,pcVar7 + bytes_read_1,0x20000);
          if (local_298 < 1) break;
          this_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     (read_offset_1 + 8);
          sVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::size(this_00);
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (this_00,(sVar8 - 0x20000) + local_298);
        }
        if (local_298 < 0) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (read_offset_1 + 8),bytes_read_1);
          piVar10 = __errno_location();
          if (((*piVar10 != 0xb) && (piVar10 = __errno_location(), *piVar10 != 4)) &&
             (piVar10 = __errno_location(), *piVar10 != 0xb)) {
            local_2d9 = 1;
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            puVar12 = (uint *)__errno_location();
            string_for_error_abi_cxx11_(&local_2d8,(phosg *)(ulong)*puVar12,error_01);
            ::std::operator+(&local_2b8,"read failed: ",&local_2d8);
            ::std::runtime_error::runtime_error(prVar11,(string *)&local_2b8);
            local_2d9 = 0;
            __cxa_throw(prVar11,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
        }
        else {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (read_offset_1 + 8),bytes_read_1);
        }
        ::std::__detail::
        _Node_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_false,_false>
        ::operator++(&__end1);
      } while( true );
    }
    Poll::poll((Poll *)&__begin2,(pollfd *)local_f8,1000,(int)__return_storage_ptr__);
    __end2 = ::std::
             unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
             ::begin((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                      *)&__begin2);
    pfd = (pair<const_int,_short> *)
          ::std::
          unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
          ::end((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                 *)&__begin2);
    while (bVar1 = ::std::__detail::operator==
                             (&__end2.super__Node_iterator_base<std::pair<const_int,_short>,_false>,
                              (_Node_iterator_base<std::pair<const_int,_short>,_false> *)&pfd),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      buf = (string *)
            ::std::__detail::_Node_iterator<std::pair<const_int,_short>,_false,_false>::operator*
                      (&__end2);
      if (((ulong)(buf->_M_dataplus)._M_p & 0x100000000) == 0) {
LAB_0016d478:
        if (((ulong)(buf->_M_dataplus)._M_p & 0x400000000) != 0) {
          bytes_to_write =
               (size_t)::std::
                       unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
                       ::at((unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
                             *)&read_fd_to_buffer._M_h._M_single_bucket,(key_type *)buf);
          sVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::size(((mapped_type *)bytes_to_write)->buf);
          bytes_written = sVar8 - *(long *)(bytes_to_write + 8);
          iVar3 = *(int *)&(buf->_M_dataplus)._M_p;
          pcVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::data(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           bytes_to_write);
          local_220 = write(iVar3,pcVar7 + *(long *)(bytes_to_write + 8),bytes_written);
          if (local_220 < 1) {
            if (local_220 < 0) {
              piVar10 = __errno_location();
              if (((*piVar10 != 0xb) && (piVar10 = __errno_location(), *piVar10 != 4)) &&
                 (piVar10 = __errno_location(), *piVar10 != 0xb)) {
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                puVar12 = (uint *)__errno_location();
                string_for_error_abi_cxx11_(&local_260,(phosg *)(ulong)*puVar12,error_00);
                ::std::operator+(&local_240,"write failed: ",&local_260);
                ::std::runtime_error::runtime_error(prVar11,(string *)&local_240);
                __cxa_throw(prVar11,&::std::runtime_error::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
            }
            else {
              Poll::remove((Poll *)local_f8,(char *)(ulong)*(uint *)&(buf->_M_dataplus)._M_p);
              ::std::
              unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
              ::erase((unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
                       *)&read_fd_to_buffer._M_h._M_single_bucket,(key_type *)buf);
            }
          }
          else {
            *(ssize_t *)(bytes_to_write + 8) = local_220 + *(long *)(bytes_to_write + 8);
            sVar8 = *(size_type *)(bytes_to_write + 8);
            sVar9 = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                              (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                 **)bytes_to_write);
            if (sVar8 == sVar9) {
              uVar5 = Subprocess::stdin_fd
                                ((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4)
                                );
              Poll::remove((Poll *)local_f8,(char *)(ulong)uVar5);
              ::std::
              unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
              ::erase((unordered_map<int,_Buffer,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Buffer>_>_>
                       *)&read_fd_to_buffer._M_h._M_single_bucket,(key_type *)buf);
            }
          }
        }
      }
      else {
        ppbVar6 = ::std::
                  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                  ::at((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                        *)&p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(key_type *)buf);
        read_offset = (size_t)*ppbVar6;
        bytes_read = ::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )read_offset);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)read_offset,
                   bytes_read + 0x20000);
        iVar3 = *(int *)&(buf->_M_dataplus)._M_p;
        pcVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      read_offset);
        local_1c0 = ::read(iVar3,pcVar7 + bytes_read,0x20000);
        if (0 < local_1c0) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     read_offset,bytes_read + local_1c0);
          goto LAB_0016d478;
        }
        if (-1 < local_1c0) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     read_offset,bytes_read);
          Poll::remove((Poll *)local_f8,(char *)(ulong)*(uint *)&(buf->_M_dataplus)._M_p);
          ::std::
          unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          ::erase((unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                   *)&p.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(key_type *)buf);
          goto LAB_0016d478;
        }
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)read_offset,
                   bytes_read);
        piVar10 = __errno_location();
        if (((*piVar10 != 0xb) && (piVar10 = __errno_location(), *piVar10 != 4)) &&
           (piVar10 = __errno_location(), *piVar10 != 0xb)) {
          buf_1._7_1_ = 1;
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          puVar12 = (uint *)__errno_location();
          string_for_error_abi_cxx11_(&local_200,(phosg *)(ulong)*puVar12,error);
          ::std::operator+(&local_1e0,"read failed: ",&local_200);
          ::std::runtime_error::runtime_error(prVar11,(string *)&local_1e0);
          buf_1._7_1_ = 0;
          __cxa_throw(prVar11,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      ::std::__detail::_Node_iterator<std::pair<const_int,_short>,_false,_false>::operator++
                (&__end2);
    }
    std::
    unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
    ::~unordered_map((unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
                      *)&__begin2);
    if ((timeout_usecs != 0) && (uVar13 = now(), local_48 < uVar13 - timeout_usecs)) {
      if (bVar2) {
        Subprocess::kill((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4),9,__sig
                        );
      }
      else {
        Subprocess::kill((Subprocess *)((long)&write_fd_to_buffer._M_h._M_single_bucket + 4),0xf,
                         __sig);
        bVar2 = true;
        timeout_usecs = 5000000;
        local_48 = now();
      }
    }
  } while( true );
}

Assistant:

SubprocessResult run_process(const vector<string>& cmd, const string* stdin_data,
    bool check, const std::string* cwd,
    const std::unordered_map<std::string, std::string>* env,
    size_t timeout_usecs) {
  SubprocessResult ret;
  bool terminated = false;
  uint64_t start_time = now();

  Subprocess sp(cmd, -1, -1, -1, cwd, env);

  make_fd_nonblocking(sp.stdin_fd());
  make_fd_nonblocking(sp.stdout_fd());
  make_fd_nonblocking(sp.stderr_fd());

  struct Buffer {
    const string* buf;
    size_t offset;
    Buffer(const string* buf) : buf(buf), offset(0) {}
  };
  unordered_map<int, Buffer> write_fd_to_buffer;
  unordered_map<int, string*> read_fd_to_buffer;

  Poll p;
  if (stdin_data) {
    write_fd_to_buffer.emplace(sp.stdin_fd(), stdin_data);
    p.add(sp.stdin_fd(), POLLOUT);
  } else {
    close(sp.stdin_fd());
  }
  read_fd_to_buffer.emplace(sp.stdout_fd(), &ret.stdout_contents);
  p.add(sp.stdout_fd(), POLLIN);
  read_fd_to_buffer.emplace(sp.stderr_fd(), &ret.stderr_contents);
  p.add(sp.stderr_fd(), POLLIN);

  // Read and write to pipes as long as the process is running
  while ((ret.exit_status = sp.wait(true)) == -1) {
    for (const auto& pfd : p.poll(1000)) {
      if (pfd.second & POLLIN) {
        string* buf = read_fd_to_buffer.at(pfd.first);
        size_t read_offset = buf->size();
        buf->resize(read_offset + READ_BLOCK_SIZE);
        ssize_t bytes_read = ::read(pfd.first, buf->data() + read_offset, READ_BLOCK_SIZE);
        if (bytes_read > 0) {
          buf->resize(read_offset + bytes_read);
        } else if (bytes_read < 0) {
          buf->resize(read_offset);
          if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
            continue;
          }
          throw runtime_error("read failed: " + string_for_error(errno));
        } else { // bytes_read == 0; usually means the pipe is broken
          buf->resize(read_offset);
          p.remove(pfd.first, true);
          read_fd_to_buffer.erase(pfd.first);
        }
      }
      if (pfd.second & POLLOUT) {
        auto& buf = write_fd_to_buffer.at(pfd.first);
        size_t bytes_to_write = buf.buf->size() - buf.offset;
        ssize_t bytes_written = write(pfd.first,
            buf.buf->data() + buf.offset, bytes_to_write);
        if (bytes_written > 0) {
          buf.offset += bytes_written;
          if (buf.offset == buf.buf->size()) {
            p.remove(sp.stdin_fd(), true);
            write_fd_to_buffer.erase(pfd.first);
          }
        } else if (bytes_written < 0) {
          if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
            continue;
          }
          throw runtime_error("write failed: " + string_for_error(errno));
        } else { // bytes_written == 0; usually means the pipe is broken
          p.remove(pfd.first, true);
          write_fd_to_buffer.erase(pfd.first);
        }
      }
    }

    if (timeout_usecs && (start_time < now() - timeout_usecs)) {
      if (!terminated) {
        sp.kill(SIGTERM);
        terminated = true;
        timeout_usecs = 5000000;
        start_time = now();
      } else {
        sp.kill(SIGKILL);
      }
    }
  }
  ret.elapsed_time = now() - ret.elapsed_time;

  // Read any leftover data after termination
  for (auto& it : read_fd_to_buffer) {
    for (;;) {
      size_t read_offset = it.second->size();
      it.second->resize(read_offset + READ_BLOCK_SIZE);
      ssize_t bytes_read = ::read(it.first, it.second->data() + read_offset, READ_BLOCK_SIZE);
      if (bytes_read > 0) {
        it.second->resize(it.second->size() - READ_BLOCK_SIZE + bytes_read);
      } else if (bytes_read < 0) {
        it.second->resize(read_offset);
        if (errno == EAGAIN || errno == EINTR || errno == EWOULDBLOCK) {
          break;
        }
        throw runtime_error("read failed: " + string_for_error(errno));
      } else { // bytes_read == 0; usually means the pipe is broken
        it.second->resize(read_offset);
        break;
      }
    }
  }

  if (check && sp.wait()) {
    throw runtime_error(string_printf("command returned code %d\nstdout:\n%s\nstderr:\n%s",
        sp.wait(), ret.stdout_contents.c_str(), ret.stderr_contents.c_str()));
  }

  return ret;
}